

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O0

bool ConsiderPatches(char *arg)

{
  char *pcVar1;
  char *local_28;
  char *f;
  FString *args;
  int argc;
  int i;
  char *arg_local;
  
  _argc = arg;
  args._0_4_ = DArgs::CheckParmList(Args,arg,(FString **)&f,1);
  args._4_4_ = 0;
  do {
    if ((int)args <= args._4_4_) {
      return 0 < (int)args;
    }
    pcVar1 = FString::operator_cast_to_char_((FString *)(f + (long)args._4_4_ * 8));
    local_28 = BaseFileSearch(pcVar1,".deh",false);
    if (local_28 == (char *)0x0) {
      pcVar1 = FString::operator_cast_to_char_((FString *)(f + (long)args._4_4_ * 8));
      local_28 = BaseFileSearch(pcVar1,".bex",false);
      if (local_28 != (char *)0x0) goto LAB_00592908;
    }
    else {
LAB_00592908:
      D_LoadDehFile(local_28);
    }
    args._4_4_ = args._4_4_ + 1;
  } while( true );
}

Assistant:

bool ConsiderPatches (const char *arg)
{
	int i, argc;
	FString *args;
	const char *f;

	argc = Args->CheckParmList(arg, &args);
	for (i = 0; i < argc; ++i)
	{
		if ( (f = BaseFileSearch(args[i], ".deh")) ||
			 (f = BaseFileSearch(args[i], ".bex")) )
		{
			D_LoadDehFile(f);
		}
	}
	return argc > 0;
}